

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  byte bVar1;
  int iVar2;
  curl_trc_feat *pcVar3;
  sockaddr *psVar4;
  undefined8 uVar5;
  bool bVar6;
  doh_probes *pdVar7;
  DOHcode DVar8;
  uchar *doh;
  size_t dohlen;
  size_t sVar9;
  Curl_addrinfo *pCVar10;
  Curl_dns_entry *pCVar11;
  sa_family_t sVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  bool bVar16;
  long lVar17;
  CURLcode CVar18;
  Curl_addrinfo *pCVar19;
  ushort uVar20;
  uint uVar21;
  ulong uVar22;
  DOHcode *pDVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  dohentry *pdVar27;
  anon_union_16_2_f9ece763_for_ip *paVar28;
  dohentry de;
  uint local_2f4;
  uchar *local_2f0;
  Curl_addrinfo *local_2e8;
  ushort local_2da;
  size_t local_2d8;
  char *local_2d0;
  DOHcode local_2c8;
  DOHcode local_2c4;
  ulong local_2c0;
  doh_probes *local_2b8;
  Curl_easy *local_2b0;
  Curl_dns_entry **local_2a8;
  dohentry local_2a0;
  
  local_2b8 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (local_2b8 == (doh_probes *)0x0) {
    CVar18 = CURLE_OUT_OF_MEMORY;
  }
  else if ((local_2b8->probe[0].easy_mid < 0) && (local_2b8->probe[1].easy_mid < 0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    CVar18 = (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar18 = CURLE_OK;
    if (local_2b8->pending == 0) {
      pCVar19 = (Curl_addrinfo *)local_2b8->probe;
      lVar17 = 0;
      local_2c8 = DOH_OK;
      local_2c4 = DOH_OK;
      local_2a8 = dnsp;
      Curl_doh_close(data);
      memset(&local_2a0,0,0x270);
      local_2a0.ttl = 0x7fffffff;
      do {
        Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar17),0x100);
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x80);
      pDVar23 = &local_2c8;
      lVar17 = 0;
      bVar16 = true;
      local_2e8 = pCVar19;
      local_2b0 = data;
LAB_00123163:
      lVar17 = lVar17 * 0x238;
      pCVar10 = pCVar19;
      if (*(int *)((long)pCVar19 + lVar17 + 8) != 0) {
        s = (dynbuf *)((long)pCVar19 + lVar17 + 0x218);
        doh = Curl_dyn_uptr(s);
        dohlen = Curl_dyn_len(s);
        DVar8 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < dohlen) && (DVar8 = DOH_DNS_BAD_ID, doh != (uchar *)0x0)) && (*doh == '\0')) &&
           ((doh[1] == '\0' && (DVar8 = DOH_DNS_BAD_RCODE, (doh[3] & 0xf) == 0)))) {
          uVar25 = 0xc;
          for (uVar20 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8; uVar20 != 0;
              uVar20 = uVar20 - 1) {
            do {
              uVar24 = (int)uVar25 + 1;
              if (dohlen < uVar24) goto LAB_00123521;
              bVar1 = doh[uVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00123527;
                uVar24 = (int)uVar25 + 2;
                if (dohlen < uVar24) goto LAB_00123521;
                break;
              }
              uVar24 = uVar24 + bVar1;
              uVar25 = (ulong)uVar24;
              if (dohlen < uVar25) goto LAB_00123521;
            } while (bVar1 != 0);
            uVar25 = (ulong)(uVar24 + 4);
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen < uVar25) goto LAB_00123527;
          }
          uVar20 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
          uVar24 = *(uint *)((long)pCVar19 + lVar17 + 8);
          if (uVar20 == 0) {
            local_2d8 = CONCAT71(local_2d8._1_7_,1);
          }
          else {
LAB_00123279:
            do {
              uVar21 = (int)uVar25 + 1;
              if (dohlen < uVar21) goto LAB_00123521;
              bVar1 = doh[uVar25];
              if ((bVar1 & 0xc0) == 0) {
                uVar21 = uVar21 + bVar1;
                uVar22 = (ulong)uVar21;
                if (dohlen < uVar22) goto LAB_00123521;
                uVar25 = (ulong)uVar21;
                if (bVar1 != 0) goto LAB_00123279;
              }
              else {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00123527;
                uVar22 = (ulong)((int)uVar25 + 2);
                if (dohlen < uVar22) goto LAB_00123521;
              }
              iVar2 = (int)uVar22;
              if (dohlen < iVar2 + 2) goto LAB_00123521;
              uVar21 = (uint)CONCAT11(doh[uVar22],doh[iVar2 + 1]);
              if (((uVar21 != 5) && (uVar21 != 0x27)) && (uVar24 != uVar21)) {
                DVar8 = DOH_DNS_UNEXPECTED_TYPE;
                goto LAB_00123527;
              }
              if (dohlen < iVar2 + 4) goto LAB_00123521;
              if (CONCAT11(doh[iVar2 + 2],doh[iVar2 + 3]) != 1) {
                DVar8 = DOH_DNS_UNEXPECTED_CLASS;
                goto LAB_00123527;
              }
              if (dohlen < iVar2 + 8) goto LAB_00123521;
              uVar14 = *(uint *)(doh + (iVar2 + 4));
              uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18;
              if (uVar14 < local_2a0.ttl) {
                local_2a0.ttl = uVar14;
              }
              uVar14 = iVar2 + 10;
              if (dohlen < uVar14) goto LAB_00123521;
              local_2d0 = (char *)CONCAT44(local_2d0._4_4_,uVar21);
              uVar25 = (ulong)(uVar14 + CONCAT11(doh[iVar2 + 8],doh[iVar2 + 9]));
              DVar8 = DOH_DNS_OUT_OF_RANGE;
              if (dohlen < uVar25) goto LAB_00123527;
              local_2d8 = CONCAT44(local_2d8._4_4_,uVar24);
              local_2f0 = doh;
              local_2da = uVar20;
              local_2c0 = dohlen;
              DVar8 = doh_rdata(doh,dohlen,CONCAT11(doh[iVar2 + 8],doh[iVar2 + 9]),
                                CONCAT11(doh[uVar22],doh[iVar2 + 1]),uVar14,&local_2a0);
              if (DVar8 != DOH_OK) goto LAB_00123527;
              uVar20 = local_2da - 1;
              dohlen = local_2c0;
              doh = local_2f0;
              uVar24 = (uint)local_2d8;
            } while (uVar20 != 0);
            local_2d8 = CONCAT71(local_2d8._1_7_,(short)local_2d0 != 2);
          }
          local_2f4 = (uint)uVar25;
          uVar24 = local_2f4;
          for (uVar20 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8; uVar20 != 0;
              uVar20 = uVar20 - 1) {
            do {
              uVar24 = (int)uVar25 + 1;
              if (dohlen < uVar24) goto LAB_00123521;
              bVar1 = doh[uVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_00123527;
                uVar24 = (int)uVar25 + 2;
                if (dohlen < uVar24) goto LAB_00123521;
                break;
              }
              uVar24 = uVar24 + bVar1;
              if (dohlen < uVar24) goto LAB_00123521;
              uVar25 = (ulong)uVar24;
            } while (bVar1 != 0);
            if ((dohlen < uVar24 + 8) || (dohlen < uVar24 + 10)) goto LAB_00123521;
            uVar24 = (uint)CONCAT11(doh[uVar24 + 8],doh[uVar24 + 9]) + uVar24 + 10;
            uVar25 = (ulong)uVar24;
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen < uVar25) goto LAB_00123527;
          }
          uVar20 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8;
          local_2f0 = doh;
          local_2f4 = uVar24;
          while (uVar20 != 0) {
            uVar25 = (ulong)local_2d0 >> 0x10;
            local_2d0 = (char *)CONCAT62((int6)uVar25,uVar20);
            DVar8 = doh_skipqname(local_2f0,dohlen,&local_2f4);
            if (DVar8 != DOH_OK) goto LAB_00123527;
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if ((dohlen < local_2f4 + 8) || (dohlen < local_2f4 + 10)) goto LAB_00123527;
            uVar24 = (uint)CONCAT11(local_2f0[local_2f4 + 8],local_2f0[local_2f4 + 9]) +
                     local_2f4 + 10;
            uVar25 = (ulong)uVar24;
            if (dohlen < uVar25) goto LAB_00123527;
            local_2f4 = uVar24;
            uVar20 = (short)local_2d0 - 1;
          }
          DVar8 = DOH_DNS_MALFORMAT;
          if (dohlen == uVar25) {
            DVar8 = DOH_OK;
            if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
              DVar8 = DOH_NO_CONTENT;
            }
            if ((char)local_2d8 == '\0') {
              DVar8 = DOH_OK;
            }
          }
        }
        goto LAB_00123527;
      }
      goto LAB_001235c9;
    }
  }
  return CVar18;
LAB_00123521:
  DVar8 = DOH_DNS_OUT_OF_RANGE;
LAB_00123527:
  *pDVar23 = DVar8;
  Curl_dyn_free(s);
  data = local_2b0;
  pCVar10 = local_2e8;
  if ((((local_2b0 != (Curl_easy *)0x0) && (DVar8 != DOH_OK)) &&
      (((local_2b0->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar3 = (local_2b0->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
     ) {
    pcVar15 = "bad error code";
    if (DVar8 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) {
      pcVar15 = (char *)((long)&errors_rel + (long)(int)(&errors_rel)[DVar8]);
    }
    iVar2 = *(int *)((long)pCVar19 + lVar17 + 8);
    pcVar13 = "unknown";
    if (iVar2 == 0x1c) {
      pcVar13 = "AAAA";
    }
    if (iVar2 == 1) {
      pcVar13 = "A";
    }
    Curl_infof(local_2b0,"DoH: %s type %s for %s",pcVar15,pcVar13,local_2b8->host);
  }
LAB_001235c9:
  pdVar7 = local_2b8;
  lVar17 = 1;
  pDVar23 = &local_2c4;
  bVar6 = !bVar16;
  pCVar19 = pCVar10;
  bVar16 = false;
  if (bVar6) goto LAB_0012364d;
  goto LAB_00123163;
LAB_0012364d:
  if ((local_2c8 == DOH_OK) || (CVar18 = CURLE_COULDNT_RESOLVE_HOST, local_2c4 == DOH_OK)) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_doh_trc.log_level)))) {
      Curl_infof(data,"[DoH] hostname: %s",local_2b8->host);
      doh_show(data,&local_2a0);
    }
    local_2d0 = pdVar7->host;
    local_2f0 = (uchar *)CONCAT44(local_2f0._4_4_,pdVar7->port);
    sVar9 = strlen(local_2d0);
    if (local_2a0.numaddr == 0) {
      CVar18 = CURLE_COULDNT_RESOLVE_HOST;
LAB_001238bf:
      pdVar27 = &local_2a0;
      if (local_2a0.numcname < 1) {
        return CVar18;
      }
      lVar17 = 0;
      do {
        Curl_dyn_free(pdVar27->cname);
        lVar17 = lVar17 + 1;
        pdVar27 = (dohentry *)(pdVar27->cname + 1);
      } while (lVar17 < local_2a0.numcname);
      return CVar18;
    }
    if (local_2a0.numaddr < 1) {
      local_2e8 = (Curl_addrinfo *)0x0;
    }
    else {
      local_2d8 = sVar9 + 1;
      local_2c0 = sVar9 + 0x31;
      local_2f0 = (uchar *)CONCAT44(local_2f0._4_4_,
                                    CONCAT22((short)((ulong)local_2f0 >> 0x10),
                                             (ushort)local_2f0 << 8 | (ushort)local_2f0 >> 8));
      paVar28 = &local_2a0.addr[0].ip;
      lVar17 = 0;
      local_2e8 = (Curl_addrinfo *)0x0;
      pCVar19 = (Curl_addrinfo *)0x0;
      do {
        iVar2 = ((dohaddr *)((long)paVar28 + -4))->type;
        lVar26 = 0x1c;
        if (iVar2 != 0x1c) {
          lVar26 = 0x10;
        }
        pCVar10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,local_2c0 + lVar26);
        if (pCVar10 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(local_2e8);
          CVar18 = CURLE_OUT_OF_MEMORY;
          goto LAB_001238bf;
        }
        pCVar10->ai_addr = (sockaddr *)(pCVar10 + 1);
        pcVar15 = (char *)((long)&pCVar10[1].ai_flags + lVar26);
        pCVar10->ai_canonname = pcVar15;
        memcpy(pcVar15,local_2d0,local_2d8);
        if (local_2e8 == (Curl_addrinfo *)0x0) {
          local_2e8 = pCVar10;
        }
        if (pCVar19 != (Curl_addrinfo *)0x0) {
          pCVar19->ai_next = pCVar10;
        }
        pCVar10->ai_family = (uint)(iVar2 == 0x1c) * 8 + 2;
        pCVar10->ai_socktype = 1;
        pCVar10->ai_addrlen = (curl_socklen_t)lVar26;
        psVar4 = pCVar10->ai_addr;
        if (iVar2 == 0x1c) {
          uVar5 = *(undefined8 *)((long)paVar28 + 8);
          *(undefined8 *)(psVar4->sa_data + 6) = *(undefined8 *)paVar28;
          psVar4[1].sa_family = (short)uVar5;
          psVar4[1].sa_data[0] = (char)((ulong)uVar5 >> 0x10);
          psVar4[1].sa_data[1] = (char)((ulong)uVar5 >> 0x18);
          psVar4[1].sa_data[2] = (char)((ulong)uVar5 >> 0x20);
          psVar4[1].sa_data[3] = (char)((ulong)uVar5 >> 0x28);
          psVar4[1].sa_data[4] = (char)((ulong)uVar5 >> 0x30);
          psVar4[1].sa_data[5] = (char)((ulong)uVar5 >> 0x38);
          sVar12 = 10;
        }
        else {
          *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)paVar28;
          sVar12 = 2;
        }
        psVar4->sa_family = sVar12;
        *(short *)psVar4->sa_data = (short)local_2f0;
        lVar17 = lVar17 + 1;
        paVar28 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar28 + 0x14);
        pCVar19 = pCVar10;
        data = local_2b0;
      } while (lVar17 < local_2a0.numaddr);
    }
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar19 = local_2e8;
    pCVar11 = Curl_cache_addr(data,local_2e8,local_2b8->host,0,local_2b8->port,false);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar11 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(pCVar19);
    }
    else {
      (data->state).async.dns = pCVar11;
      *local_2a8 = pCVar11;
    }
    CVar18 = CURLE_OK;
  }
  if (0 < local_2a0.numcname) {
    pdVar27 = &local_2a0;
    lVar17 = 0;
    do {
      Curl_dyn_free(pdVar27->cname);
      lVar17 = lVar17 + 1;
      pdVar27 = (dohentry *)(pdVar27->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  Curl_doh_cleanup(data);
  return CVar18;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe[DOH_SLOT_IPV4].easy_mid < 0 &&
     dohp->probe[DOH_SLOT_IPV6].easy_mid < 0) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_probe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->resp_body),
                                 Curl_dyn_len(&p->resp_body),
                                 p->dnstype, &de);
      Curl_dyn_free(&p->resp_body);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_doh_trc)) {
        infof(data, "[DoH] hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port, FALSE);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */
#ifdef USE_HTTPSRR
    if(de.numhttps_rrs > 0 && result == CURLE_OK && *dnsp) {
      struct Curl_https_rrinfo *hrr = NULL;
      result = doh_resp_decode_httpsrr(de.https_rrs->val, de.https_rrs->len,
                                       &hrr);
      if(result) {
        infof(data, "Failed to decode HTTPS RR");
        return result;
      }
      infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
      doh_print_httpsrr(data, hrr);
# endif
      (*dnsp)->hinfo = hrr;
    }
#endif

    /* All done */
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}